

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ParseUri(char *zDefaultVfs,char *zUri,uint *pFlags,sqlite3_vfs **ppVfs,char **pzFile,
                   char **pzErrMsg)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  sqlite3_vfs *psVar8;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  long lVar17;
  OpenMode *pOVar18;
  char *__s1;
  uint local_6c;
  char *local_68;
  uint local_60;
  uint local_5c;
  char *local_58;
  
  local_6c = *pFlags;
  if (zUri == (char *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0xffffffff;
    pcVar7 = zUri;
    do {
      uVar12 = uVar12 + 1;
      cVar1 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar1 != '\0');
    uVar12 = uVar12 & 0x3fffffff;
  }
  local_68 = zDefaultVfs;
  if (((uVar12 < 5) || ((local_6c & 0x40) == 0 && sqlite3Config.bOpenUri == 0)) ||
     (zUri[4] != ':' || *(int *)zUri != 0x656c6966)) {
    iVar5 = sqlite3_initialize();
    if (iVar5 != 0) {
      return 7;
    }
    pcVar7 = (char *)sqlite3Malloc(uVar12 + 2);
    if (pcVar7 == (char *)0x0) {
      return 7;
    }
    memcpy(pcVar7,zUri,(ulong)uVar12);
    (pcVar7 + uVar12)[0] = '\0';
    (pcVar7 + uVar12)[1] = '\0';
    local_6c = local_6c & 0xffffffbf;
LAB_001729a5:
    psVar8 = sqlite3_vfs_find(local_68);
    *ppVfs = psVar8;
    iVar5 = 0;
    if (psVar8 != (sqlite3_vfs *)0x0) goto LAB_001729e6;
    pcVar9 = sqlite3_mprintf("no such vfs: %s",local_68);
  }
  else {
    iVar5 = uVar12 + 2;
    uVar11 = 0;
    do {
      iVar5 = iVar5 + (uint)(zUri[uVar11] == '&');
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
    iVar6 = sqlite3_initialize();
    if (iVar6 != 0) {
      return 7;
    }
    pcVar7 = (char *)sqlite3Malloc(iVar5);
    if (pcVar7 == (char *)0x0) {
      return 7;
    }
    local_6c = local_6c | 0x40;
    uVar11 = 5;
    if ((zUri[5] != '/') || (zUri[6] != '/')) {
LAB_00172abf:
      iVar6 = 0;
      iVar5 = 0;
      do {
        lVar13 = (long)iVar5;
        uVar11 = uVar11 & 0xffffffff;
LAB_00172ad0:
        uVar12 = (uint)uVar11;
        bVar15 = zUri[(int)uVar12];
        if ((bVar15 == 0) || (bVar15 == 0x23)) {
          if (iVar6 == 1) {
            pcVar7[lVar13] = '\0';
            lVar13 = (long)(iVar5 + 1);
          }
          (pcVar7 + lVar13)[0] = '\0';
          (pcVar7 + lVar13)[1] = '\0';
          lVar13 = -1;
          do {
            lVar17 = lVar13 + 1;
            lVar13 = lVar13 + 1;
          } while (pcVar7[lVar17] != '\0');
          uVar11 = (ulong)((uint)lVar13 & 0x3fffffff);
          if (pcVar7[uVar11 + 1] == '\0') goto LAB_001729a5;
          pcVar9 = pcVar7 + uVar11;
          while( true ) {
            piVar10 = (int *)(pcVar9 + 1);
            lVar13 = 0;
            do {
              lVar17 = lVar13 + 2;
              lVar13 = lVar13 + 1;
            } while (pcVar9[lVar17] != '\0');
            uVar12 = (uint)lVar13 & 0x3fffffff;
            __s1 = (char *)((long)piVar10 + (ulong)uVar12 + 1);
            lVar17 = -1;
            do {
              lVar4 = lVar17 + (ulong)uVar12 + 2;
              lVar17 = lVar17 + 1;
            } while (*(char *)((long)piVar10 + lVar4) != '\0');
            uVar14 = (uint)lVar13 & 0x3fffffff;
            uVar16 = (uint)lVar17;
            if (uVar14 == 5) break;
            if (uVar14 == 4) {
              if (*piVar10 == 0x65646f6d) {
                local_5c = local_6c & 0x87;
                local_60 = 0xffffff78;
                pOVar18 = sqlite3ParseUri::aOpenMode;
                local_58 = "access";
                goto LAB_00172d73;
              }
            }
            else if ((uVar14 == 3) && (pcVar9[3] == 's' && (short)*piVar10 == 0x6676)) {
              local_68 = __s1;
            }
LAB_00172e23:
            pcVar9 = __s1 + (uVar16 & 0x3fffffff);
            if (*(char *)((long)piVar10 + (ulong)(uVar16 & 0x3fffffff) + (ulong)uVar12 + 2) == '\0')
            goto LAB_001729a5;
          }
          if (pcVar9[5] != 'e' || *piVar10 != 0x68636163) goto LAB_00172e23;
          local_5c = 0x60000;
          local_60 = 0xfff9ffff;
          pOVar18 = sqlite3ParseUri::aCacheMode;
          local_58 = "cache";
LAB_00172d73:
          pcVar9 = pOVar18->z;
          if (pcVar9 == (char *)0x0) {
LAB_00172e42:
            pcVar9 = sqlite3_mprintf("no such %s mode: %s",local_58,__s1);
            iVar5 = 1;
          }
          else {
            lVar13 = 0;
            while( true ) {
              lVar17 = -1;
              do {
                lVar4 = lVar17 + 1;
                lVar17 = lVar17 + 1;
              } while (pcVar9[lVar4] != '\0');
              if (((((uint)lVar17 ^ uVar16) & 0x3fffffff) == 0) &&
                 (iVar5 = bcmp(__s1,pcVar9,(ulong)(uVar16 & 0x3fffffff)), iVar5 == 0)) break;
              lVar13 = lVar13 + 1;
              pcVar9 = pOVar18[lVar13].z;
              if (pcVar9 == (char *)0x0) goto LAB_00172e42;
            }
            uVar14 = pOVar18[lVar13].mode;
            if (uVar14 == 0) goto LAB_00172e42;
            if ((int)(uVar14 & 0xffffff7f) <= (int)local_5c) {
              local_6c = uVar14 | local_60 & local_6c;
              goto LAB_00172e23;
            }
            pcVar9 = sqlite3_mprintf("%s mode not allowed: %s",local_58,__s1);
            iVar5 = 3;
          }
          goto LAB_001729d4;
        }
        uVar14 = uVar12 + 1;
        uVar11 = (ulong)uVar14;
        if (((bVar15 == 0x25) && (bVar2 = zUri[(int)uVar14], (""[bVar2] & 8) != 0)) &&
           (bVar3 = zUri[(long)(int)uVar12 + 2], (""[bVar3] & 8) != 0)) {
          uVar11 = (ulong)(uVar12 + 3);
          bVar15 = ((char)(bVar3 * '\x02') >> 7 & 9U) + bVar3 & 0xf |
                   (((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2) * '\x10';
          if (bVar15 == 0) goto code_r0x00172b4e;
          goto LAB_00172bf7;
        }
        if (iVar6 != 1) {
          if (((iVar6 != 0) || (bVar15 != 0x3f)) && ((iVar6 != 2 || (bVar15 != 0x26))))
          goto LAB_00172bf7;
LAB_00172c2b:
          iVar6 = 1;
          goto LAB_00172c3e;
        }
        if ((bVar15 != 0x3d) && (bVar15 != 0x26)) {
          iVar6 = 1;
          goto LAB_00172bf7;
        }
        if (pcVar7[lVar13 + -1] == '\0') {
          pcVar9 = zUri + (int)uVar14;
          while( true ) {
            uVar12 = uVar12 + 1;
            uVar11 = (ulong)uVar12;
            iVar6 = 1;
            if (((*pcVar9 == '\0') || (*pcVar9 == '#')) || (pcVar9[-1] == '&')) break;
            pcVar9 = pcVar9 + 1;
          }
          goto LAB_00172ad0;
        }
        if (bVar15 == 0x26) {
          iVar5 = iVar5 + 1;
          pcVar7[lVar13] = '\0';
          lVar13 = (long)iVar5;
          goto LAB_00172c2b;
        }
        iVar6 = 2;
LAB_00172c3e:
        bVar15 = 0;
LAB_00172bf7:
        iVar5 = iVar5 + 1;
        pcVar7[lVar13] = bVar15;
      } while( true );
    }
    for (lVar13 = 0; (zUri[lVar13 + 7] != '\0' && (zUri[lVar13 + 7] != '/')); lVar13 = lVar13 + 1) {
    }
    uVar11 = lVar13 + 7;
    if ((int)uVar11 == 0x10) {
      if (zUri[0xf] == 't' && *(long *)(zUri + 7) == 0x736f686c61636f6c) {
        uVar11 = 0x10;
        goto LAB_00172abf;
      }
    }
    else if ((int)uVar11 == 7) goto LAB_00172abf;
    pcVar9 = sqlite3_mprintf("invalid uri authority: %.*s",lVar13,zUri + 7);
  }
  iVar5 = 1;
LAB_001729d4:
  *pzErrMsg = pcVar9;
  sqlite3_free(pcVar7);
  pcVar7 = (char *)0x0;
LAB_001729e6:
  *pFlags = local_6c;
  *pzFile = pcVar7;
  return iVar5;
code_r0x00172b4e:
  for (pcVar9 = zUri + (int)(uVar12 + 3);
      ((cVar1 = *pcVar9, cVar1 != '\0' && (cVar1 != '#')) && ((iVar6 != 0 || (cVar1 != '?'))));
      pcVar9 = pcVar9 + 1) {
    if (iVar6 == 1) {
      if ((cVar1 == '&') || (cVar1 == '=')) break;
    }
    else if ((iVar6 == 2) && (cVar1 == '&')) break;
    uVar11 = (ulong)((int)uVar11 + 1);
  }
  goto LAB_00172ad0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ParseUri(
  const char *zDefaultVfs,        /* VFS to use if no "vfs=xxx" query option */
  const char *zUri,               /* Nul-terminated URI to parse */
  unsigned int *pFlags,           /* IN/OUT: SQLITE_OPEN_XXX flags */
  sqlite3_vfs **ppVfs,            /* OUT: VFS to use */ 
  char **pzFile,                  /* OUT: Filename component of URI */
  char **pzErrMsg                 /* OUT: Error message (if rc!=SQLITE_OK) */
){
  int rc = SQLITE_OK;
  unsigned int flags = *pFlags;
  const char *zVfs = zDefaultVfs;
  char *zFile;
  char c;
  int nUri = sqlite3Strlen30(zUri);

  assert( *pzErrMsg==0 );

  if( ((flags & SQLITE_OPEN_URI) || sqlite3GlobalConfig.bOpenUri) 
   && nUri>=5 && memcmp(zUri, "file:", 5)==0 
  ){
    char *zOpt;
    int eState;                   /* Parser state when parsing URI */
    int iIn;                      /* Input character index */
    int iOut = 0;                 /* Output character index */
    int nByte = nUri+2;           /* Bytes of space to allocate */

    /* Make sure the SQLITE_OPEN_URI flag is set to indicate to the VFS xOpen 
    ** method that there may be extra parameters following the file-name.  */
    flags |= SQLITE_OPEN_URI;

    for(iIn=0; iIn<nUri; iIn++) nByte += (zUri[iIn]=='&');
    zFile = sqlite3_malloc(nByte);
    if( !zFile ) return SQLITE_NOMEM;

    /* Discard the scheme and authority segments of the URI. */
    if( zUri[5]=='/' && zUri[6]=='/' ){
      iIn = 7;
      while( zUri[iIn] && zUri[iIn]!='/' ) iIn++;

      if( iIn!=7 && (iIn!=16 || memcmp("localhost", &zUri[7], 9)) ){
        *pzErrMsg = sqlite3_mprintf("invalid uri authority: %.*s", 
            iIn-7, &zUri[7]);
        rc = SQLITE_ERROR;
        goto parse_uri_out;
      }
    }else{
      iIn = 5;
    }

    /* Copy the filename and any query parameters into the zFile buffer. 
    ** Decode %HH escape codes along the way. 
    **
    ** Within this loop, variable eState may be set to 0, 1 or 2, depending
    ** on the parsing context. As follows:
    **
    **   0: Parsing file-name.
    **   1: Parsing name section of a name=value query parameter.
    **   2: Parsing value section of a name=value query parameter.
    */
    eState = 0;
    while( (c = zUri[iIn])!=0 && c!='#' ){
      iIn++;
      if( c=='%' 
       && sqlite3Isxdigit(zUri[iIn]) 
       && sqlite3Isxdigit(zUri[iIn+1]) 
      ){
        int octet = (sqlite3HexToInt(zUri[iIn++]) << 4);
        octet += sqlite3HexToInt(zUri[iIn++]);

        assert( octet>=0 && octet<256 );
        if( octet==0 ){
          /* This branch is taken when "%00" appears within the URI. In this
          ** case we ignore all text in the remainder of the path, name or
          ** value currently being parsed. So ignore the current character
          ** and skip to the next "?", "=" or "&", as appropriate. */
          while( (c = zUri[iIn])!=0 && c!='#' 
              && (eState!=0 || c!='?')
              && (eState!=1 || (c!='=' && c!='&'))
              && (eState!=2 || c!='&')
          ){
            iIn++;
          }
          continue;
        }
        c = octet;
      }else if( eState==1 && (c=='&' || c=='=') ){
        if( zFile[iOut-1]==0 ){
          /* An empty option name. Ignore this option altogether. */
          while( zUri[iIn] && zUri[iIn]!='#' && zUri[iIn-1]!='&' ) iIn++;
          continue;
        }
        if( c=='&' ){
          zFile[iOut++] = '\0';
        }else{
          eState = 2;
        }
        c = 0;
      }else if( (eState==0 && c=='?') || (eState==2 && c=='&') ){
        c = 0;
        eState = 1;
      }
      zFile[iOut++] = c;
    }
    if( eState==1 ) zFile[iOut++] = '\0';
    zFile[iOut++] = '\0';
    zFile[iOut++] = '\0';

    /* Check if there were any options specified that should be interpreted 
    ** here. Options that are interpreted here include "vfs" and those that
    ** correspond to flags that may be passed to the sqlite3_open_v2()
    ** method. */
    zOpt = &zFile[sqlite3Strlen30(zFile)+1];
    while( zOpt[0] ){
      int nOpt = sqlite3Strlen30(zOpt);
      char *zVal = &zOpt[nOpt+1];
      int nVal = sqlite3Strlen30(zVal);

      if( nOpt==3 && memcmp("vfs", zOpt, 3)==0 ){
        zVfs = zVal;
      }else{
        struct OpenMode {
          const char *z;
          int mode;
        } *aMode = 0;
        char *zModeType = 0;
        int mask = 0;
        int limit = 0;

        if( nOpt==5 && memcmp("cache", zOpt, 5)==0 ){
          static struct OpenMode aCacheMode[] = {
            { "shared",  SQLITE_OPEN_SHAREDCACHE },
            { "private", SQLITE_OPEN_PRIVATECACHE },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_SHAREDCACHE|SQLITE_OPEN_PRIVATECACHE;
          aMode = aCacheMode;
          limit = mask;
          zModeType = "cache";
        }
        if( nOpt==4 && memcmp("mode", zOpt, 4)==0 ){
          static struct OpenMode aOpenMode[] = {
            { "ro",  SQLITE_OPEN_READONLY },
            { "rw",  SQLITE_OPEN_READWRITE }, 
            { "rwc", SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE },
            { "memory", SQLITE_OPEN_MEMORY },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_READONLY | SQLITE_OPEN_READWRITE
                   | SQLITE_OPEN_CREATE | SQLITE_OPEN_MEMORY;
          aMode = aOpenMode;
          limit = mask & flags;
          zModeType = "access";
        }

        if( aMode ){
          int i;
          int mode = 0;
          for(i=0; aMode[i].z; i++){
            const char *z = aMode[i].z;
            if( nVal==sqlite3Strlen30(z) && 0==memcmp(zVal, z, nVal) ){
              mode = aMode[i].mode;
              break;
            }
          }
          if( mode==0 ){
            *pzErrMsg = sqlite3_mprintf("no such %s mode: %s", zModeType, zVal);
            rc = SQLITE_ERROR;
            goto parse_uri_out;
          }
          if( (mode & ~SQLITE_OPEN_MEMORY)>limit ){
            *pzErrMsg = sqlite3_mprintf("%s mode not allowed: %s",
                                        zModeType, zVal);
            rc = SQLITE_PERM;
            goto parse_uri_out;
          }
          flags = (flags & ~mask) | mode;
        }
      }

      zOpt = &zVal[nVal+1];
    }

  }else{
    zFile = sqlite3_malloc(nUri+2);
    if( !zFile ) return SQLITE_NOMEM;
    memcpy(zFile, zUri, nUri);
    zFile[nUri] = '\0';
    zFile[nUri+1] = '\0';
    flags &= ~SQLITE_OPEN_URI;
  }

  *ppVfs = sqlite3_vfs_find(zVfs);
  if( *ppVfs==0 ){
    *pzErrMsg = sqlite3_mprintf("no such vfs: %s", zVfs);
    rc = SQLITE_ERROR;
  }
 parse_uri_out:
  if( rc!=SQLITE_OK ){
    sqlite3_free(zFile);
    zFile = 0;
  }
  *pFlags = flags;
  *pzFile = zFile;
  return rc;
}